

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::FunctionBody::SetCheckCodeGenEntryPoint
          (FunctionBody *this,FunctionEntryPointInfo *entryPointInfo,JavascriptMethod entryPoint)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  JavascriptMethod p_Var5;
  ProxyEntryPointInfo **ppPVar6;
  FunctionEntryPointInfo *pFVar7;
  JavascriptMethod p_Var8;
  JavascriptMethod entryPoint_local;
  FunctionEntryPointInfo *entryPointInfo_local;
  FunctionBody *this_local;
  
  BVar3 = IsIntermediateCodeGenThunk(entryPoint);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xedc,"(IsIntermediateCodeGenThunk(entryPoint))",
                                "IsIntermediateCodeGenThunk(entryPoint)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  p_Var5 = GetEntryPoint(this,(ProxyEntryPointInfo *)entryPointInfo);
  if (p_Var5 != ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                CurrentThunk) {
    ppPVar6 = Memory::WriteBarrierPtr::operator_cast_to_ProxyEntryPointInfo__
                        ((WriteBarrierPtr *)
                         &(this->super_ParseableFunctionInfo).super_FunctionProxy.
                          m_defaultEntryPointInfo);
    if (entryPointInfo == (FunctionEntryPointInfo *)*ppPVar6) {
      BVar3 = IsInterpreterThunk(this);
      if (BVar3 != 0) goto LAB_00a1f6d3;
    }
    pFVar7 = GetSimpleJitEntryPointInfo(this);
    if (pFVar7 != (FunctionEntryPointInfo *)0x0) {
      p_Var5 = GetEntryPoint(this,(ProxyEntryPointInfo *)entryPointInfo);
      pFVar7 = GetSimpleJitEntryPointInfo(this);
      p_Var8 = EntryPointInfo::GetNativeEntrypoint(&pFVar7->super_EntryPointInfo);
      if (p_Var5 == p_Var8) goto LAB_00a1f6d3;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xee3,
                                "(this->GetEntryPoint(entryPointInfo) == m_scriptContext->CurrentThunk || (entryPointInfo == this->m_defaultEntryPointInfo && this->IsInterpreterThunk()) || ( GetSimpleJitEntryPointInfo() && GetEntryPoint(entryPointInfo) == GetSimpleJitEntryPointInfo()->GetNativeEntrypoint() ))"
                                ,
                                "this->GetEntryPoint(entryPointInfo) == m_scriptContext->CurrentThunk || (entryPointInfo == this->m_defaultEntryPointInfo && this->IsInterpreterThunk()) || ( GetSimpleJitEntryPointInfo() && GetEntryPoint(entryPointInfo) == GetSimpleJitEntryPointInfo()->GetNativeEntrypoint() )"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
LAB_00a1f6d3:
  ParseableFunctionInfo::SetEntryPoint
            (&this->super_ParseableFunctionInfo,(ProxyEntryPointInfo *)entryPointInfo,entryPoint);
  return;
}

Assistant:

void FunctionBody::SetCheckCodeGenEntryPoint(FunctionEntryPointInfo* entryPointInfo, JavascriptMethod entryPoint)
    {
        Assert(IsIntermediateCodeGenThunk(entryPoint));
        Assert(
            this->GetEntryPoint(entryPointInfo) == m_scriptContext->CurrentThunk ||
            (entryPointInfo == this->m_defaultEntryPointInfo && this->IsInterpreterThunk()) ||
            (
                GetSimpleJitEntryPointInfo() &&
                GetEntryPoint(entryPointInfo) == GetSimpleJitEntryPointInfo()->GetNativeEntrypoint()
            ));
        this->SetEntryPoint(entryPointInfo, entryPoint);
    }